

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>::
write_decimal<__int128>
          (arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler> *this,
          __int128 value)

{
  buffer<char> *pbVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  byte bVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  char *in_RDX;
  ulong uVar8;
  buffer<char> *c;
  ulong in_RSI;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  undefined1 *puVar12;
  char *pcVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  ptrdiff_t _Num;
  char *in_stack_ffffffffffffff68;
  arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>
  *in_stack_ffffffffffffff70;
  undefined1 local_88 [88];
  
  pcVar13 = in_RDX;
  if ((long)in_RDX < 0) {
    bVar14 = in_RSI != 0;
    in_RSI = -in_RSI;
    pcVar13 = (char *)(-(ulong)bVar14 - (long)in_RDX);
  }
  auVar2._8_8_ = pcVar13;
  auVar2._0_8_ = in_RSI;
  uVar10 = 1;
  if ((char *)(ulong)(in_RSI < 10) <= pcVar13) {
    uVar3 = 4;
    auVar15 = auVar2;
    do {
      uVar10 = uVar3;
      uVar5 = auVar15._8_8_;
      uVar8 = auVar15._0_8_;
      in_stack_ffffffffffffff68 = in_RDX;
      in_stack_ffffffffffffff70 = this;
      if (uVar5 == 0 && (ulong)(99 < uVar8) <= -uVar5) {
        uVar10 = uVar10 - 2;
        goto LAB_0010b9ab;
      }
      if (uVar5 == 0 && (ulong)(999 < uVar8) <= -uVar5) {
        uVar10 = uVar10 - 1;
        goto LAB_0010b9ab;
      }
      if (uVar5 < (uVar8 < 10000)) goto LAB_0010b9ab;
      auVar15 = __udivti3(uVar8,uVar5,10000,0);
      uVar3 = uVar10 + 4;
    } while (uVar5 != 0 || -uVar5 < (ulong)(99999 < uVar8));
    uVar10 = uVar10 + 1;
    in_stack_ffffffffffffff68 = in_RDX;
    in_stack_ffffffffffffff70 = this;
  }
LAB_0010b9ab:
  pbVar1 = (this->out_).container;
  pcVar6 = (char *)pbVar1->size_;
  pcVar11 = pcVar6 + ((long)(int)uVar10 - ((long)in_RDX >> 0x3f));
  if ((char *)pbVar1->capacity_ < pcVar11) {
    (**pbVar1->_vptr_buffer)(pbVar1,pcVar11);
    in_stack_ffffffffffffff68 = pcVar6;
  }
  pcVar6 = pcVar6 + (long)pbVar1->ptr_;
  pbVar1->size_ = (size_t)pcVar11;
  if ((long)in_RDX < 0) {
    *pcVar6 = '-';
    pcVar6 = pcVar6 + 1;
  }
  if ((int)uVar10 < 0) {
    assert_fail((char *)in_stack_ffffffffffffff70,0,in_stack_ffffffffffffff68);
  }
  uVar5 = (ulong)uVar10;
  puVar12 = local_88 + uVar5;
  auVar15 = auVar2;
  if ((char *)(ulong)(in_RSI < 100) <= pcVar13) {
    do {
      lVar7 = auVar2._8_8_;
      uVar8 = auVar2._0_8_;
      auVar15 = __udivti3(uVar8,lVar7,100,0);
      uVar9 = (ulong)(uint)(auVar2._0_4_ + auVar15._0_4_ * -100);
      puVar12[-1] = basic_data<void>::digits[(uVar9 * 2 & 0xffffffff) + 1];
      puVar12[-2] = basic_data<void>::digits[uVar9 * 2];
      puVar12 = puVar12 + -2;
      auVar2 = auVar15;
    } while (lVar7 != 0 || (ulong)-lVar7 < (ulong)(9999 < uVar8));
  }
  if (auVar15._8_8_ == 0 && (ulong)(9 < auVar15._0_8_) <= (ulong)-auVar15._8_8_) {
    bVar4 = auVar15[0] | 0x30;
    lVar7 = -1;
  }
  else {
    uVar8 = auVar15._0_8_ * 2;
    puVar12[-1] = basic_data<void>::digits[(uVar8 & 0xffffffff) + 1];
    bVar4 = basic_data<void>::digits[uVar8 & 0x1fffffffe];
    lVar7 = -2;
  }
  puVar12[lVar7] = bVar4;
  memcpy(pcVar6,local_88,uVar5);
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }